

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableI2cAnalyzer.cpp
# Opt level: O1

bool __thiscall EnrichableI2cAnalyzer::GetBitPartTwo(EnrichableI2cAnalyzer *this)

{
  AnalyzerChannelData *pAVar1;
  byte bVar2;
  byte bVar3;
  
  AnalyzerChannelData::AdvanceToNextEdge();
  pAVar1 = this->mSda;
  AnalyzerChannelData::GetSampleNumber();
  bVar2 = AnalyzerChannelData::WouldAdvancingToAbsPositionCauseTransition((ulonglong)pAVar1);
  bVar3 = bVar2;
  while (bVar3 != 0) {
    AnalyzerChannelData::AdvanceToNextEdge();
    RecordStartStopBit(this);
    pAVar1 = this->mSda;
    AnalyzerChannelData::GetSampleNumber();
    bVar3 = AnalyzerChannelData::WouldAdvancingToAbsPositionCauseTransition((ulonglong)pAVar1);
  }
  return (bool)(bVar2 ^ 1);
}

Assistant:

bool EnrichableI2cAnalyzer::GetBitPartTwo()
{
	//the sda and scl should be synced up, and we are either on a stop/start condition (clock high) or we're on a regular bit( clock high).
	//we also should not expect any more start/stop conditions before the next falling edge, I beleive.

	//move to next falling edge.
	bool result = true;
	mScl->AdvanceToNextEdge();
	while( mSda->WouldAdvancingToAbsPositionCauseTransition( mScl->GetSampleNumber() - 1 ) == true )
	{
		//clock is high -- SDA changes indicate start, stop, etc.
		mSda->AdvanceToNextEdge();
		RecordStartStopBit();
		result = false;
	}
	return result;
}